

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MauTools.cpp
# Opt level: O3

bool mau::SetCurrentThreadPriority(ThreadPriority prio)

{
  int iVar1;
  
  iVar1 = 0;
  if (prio < 4) {
    iVar1 = *(int *)(&DAT_00114230 + (ulong)prio * 4);
  }
  iVar1 = nice(iVar1);
  return iVar1 != -1;
}

Assistant:

bool SetCurrentThreadPriority(ThreadPriority prio)
{
#ifdef _WIN32
    int winPrio = THREAD_PRIORITY_NORMAL;
    switch (prio)
    {
    case ThreadPriority::High: winPrio = THREAD_PRIORITY_ABOVE_NORMAL; break;
    case ThreadPriority::Low:  winPrio = THREAD_PRIORITY_BELOW_NORMAL; break;
    case ThreadPriority::Idle: winPrio = THREAD_PRIORITY_IDLE; break;
    default: break;
    }
    return 0 != ::SetThreadPriority(::GetCurrentThread(), winPrio);
#else
    int niceness = 0;
    switch (prio)
    {
    case ThreadPriority::High: niceness = 2; break;
    case ThreadPriority::Low:  niceness = -2; break;
    case ThreadPriority::Idle: niceness = 19; break;
    default: break;
    }
    return -1 != nice(niceness);
#endif
}